

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void finish_pass1(j_decompress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  jpeg_color_quantizer *pjVar6;
  jpeg_error_mgr *pjVar7;
  boxptr boxp_00;
  ulong uVar8;
  long lVar9;
  boxptr boxp;
  boxptr pbVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  boxptr which;
  boxptr boxp_01;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int *piVar25;
  int iVar26;
  int iVar27;
  char cVar28;
  long lVar29;
  bool bVar30;
  
  pjVar6 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar6[1].start_pass;
  uVar1 = *(uint *)&pjVar6[1].color_quantize;
  boxp_00 = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)(int)uVar1 * 0x28);
  boxp_00->c0min = 0;
  boxp_00->c0max = 0x1f;
  boxp_00->c1min = 0;
  boxp_00->c1max = 0x3f;
  boxp_00->c2min = 0;
  boxp_00->c2max = 0x1f;
  update_box(cinfo,boxp_00);
  uVar16 = 1;
  if (1 < (int)uVar1) {
    uVar16 = uVar1;
  }
  for (uVar20 = 1; (long)uVar20 < (long)(int)uVar1; uVar20 = uVar20 + 1) {
    if ((int)uVar1 < (int)uVar20 * 2) {
      lVar9 = 0;
      boxp_01 = (boxptr)0x0;
      uVar8 = uVar20;
      pbVar10 = boxp_00;
      while (bVar30 = uVar8 != 0, uVar8 = uVar8 - 1, bVar30) {
        if (lVar9 < pbVar10->volume) {
          boxp_01 = pbVar10;
          lVar9 = pbVar10->volume;
        }
        pbVar10 = pbVar10 + 1;
      }
    }
    else {
      lVar9 = 0;
      boxp_01 = (boxptr)0x0;
      uVar8 = uVar20;
      pbVar10 = boxp_00;
      while (bVar30 = uVar8 != 0, uVar8 = uVar8 - 1, bVar30) {
        if ((lVar9 < pbVar10->colorcount) && (0 < pbVar10->volume)) {
          lVar9 = pbVar10->colorcount;
          boxp_01 = pbVar10;
        }
        pbVar10 = pbVar10 + 1;
      }
    }
    if (boxp_01 == (boxptr)0x0) goto LAB_00124453;
    iVar27 = boxp_01->c0max;
    boxp_00[uVar20].c0max = iVar27;
    iVar2 = boxp_01->c1max;
    boxp_00[uVar20].c1max = iVar2;
    iVar3 = boxp_01->c2max;
    boxp_00[uVar20].c2max = iVar3;
    iVar4 = boxp_01->c0min;
    boxp_00[uVar20].c0min = iVar4;
    iVar19 = boxp_01->c1min;
    boxp_00[uVar20].c1min = iVar19;
    iVar5 = boxp_01->c2min;
    boxp_00[uVar20].c2min = iVar5;
    uVar8 = (ulong)cinfo->out_color_space;
    iVar13 = (iVar2 - iVar19) * c_scales[rgb_green[uVar8]];
    iVar24 = (iVar27 - iVar4) * c_scales[rgb_red[uVar8]] * 8;
    iVar14 = iVar13 * 4;
    iVar26 = (iVar3 - iVar5) * c_scales[rgb_blue[uVar8]] * 8;
    if ((0x10c4UL >> (uVar8 & 0x3f) & 1) == 0) {
      iVar15 = iVar14;
      if (iVar26 != iVar14 && SBORROW4(iVar26,iVar14) == iVar26 + iVar13 * -4 < 0) {
        iVar15 = iVar26;
      }
      if (iVar15 < iVar24) {
LAB_0012440c:
        piVar25 = &boxp_01->c0max;
        iVar19 = iVar4 + iVar27;
        pbVar10 = boxp_00 + uVar20;
      }
      else {
        cVar28 = (iVar14 < iVar26) + '\x01';
LAB_001243d2:
        if (cVar28 == '\x02') goto LAB_001243f5;
        if (cVar28 != '\x01') goto LAB_0012440c;
        piVar25 = &boxp_01->c1max;
        iVar19 = iVar19 + iVar2;
        pbVar10 = (boxptr)&boxp_00[uVar20].c1min;
      }
    }
    else {
      cVar28 = iVar24 <= iVar14;
      if (iVar24 != iVar14 && SBORROW4(iVar24,iVar14) == iVar24 + iVar13 * -4 < 0) {
        iVar14 = iVar24;
      }
      if (iVar26 <= iVar14) goto LAB_001243d2;
LAB_001243f5:
      piVar25 = &boxp_01->c2max;
      pbVar10 = (boxptr)&boxp_00[uVar20].c2min;
      iVar19 = iVar5 + iVar3;
    }
    *piVar25 = iVar19 / 2;
    pbVar10->c0min = iVar19 / 2 + 1;
    update_box(cinfo,boxp_01);
    update_box(cinfo,boxp_00 + uVar20);
  }
  uVar20 = (ulong)uVar16;
LAB_00124453:
  for (uVar8 = 0; uVar8 != (uVar20 & 0xffffffff); uVar8 = uVar8 + 1) {
    lVar22 = 0;
    lVar9 = 0;
    lVar18 = 0;
    lVar11 = 0;
    for (lVar23 = (long)boxp_00[uVar8].c0min; lVar23 <= boxp_00[uVar8].c0max; lVar23 = lVar23 + 1) {
      lVar29 = (long)boxp_00[uVar8].c1min << 6;
      for (lVar21 = (long)boxp_00[uVar8].c1min; lVar21 <= boxp_00[uVar8].c1max; lVar21 = lVar21 + 1)
      {
        iVar27 = boxp_00[uVar8].c2min * 8 + 4;
        for (lVar17 = (long)boxp_00[uVar8].c2min; lVar17 <= boxp_00[uVar8].c2max;
            lVar17 = lVar17 + 1) {
          uVar12 = (ulong)*(ushort *)
                           (*(long *)(cinfo->cquantize[1].finish_pass + lVar23 * 8) + lVar29 +
                           lVar17 * 2);
          if (uVar12 != 0) {
            lVar22 = lVar22 + uVar12;
            lVar9 = lVar9 + uVar12 * (long)((int)lVar23 * 8 + 4);
            lVar18 = lVar18 + uVar12 * (long)((int)lVar21 * 4 + 2);
            lVar11 = lVar11 + (long)iVar27 * uVar12;
          }
          iVar27 = iVar27 + 8;
        }
        lVar29 = lVar29 + 0x40;
      }
    }
    lVar23 = lVar22 >> 1;
    (*cinfo->colormap)[uVar8] = (JSAMPLE)((lVar9 + lVar23) / lVar22);
    cinfo->colormap[1][uVar8] = (JSAMPLE)((lVar18 + lVar23) / lVar22);
    cinfo->colormap[2][uVar8] = (JSAMPLE)((lVar11 + lVar23) / lVar22);
  }
  cinfo->actual_number_of_colors = (int)uVar20;
  pjVar7 = cinfo->err;
  pjVar7->msg_code = 0x60;
  (pjVar7->msg_parm).i[0] = (int)uVar20;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  *(undefined4 *)&pjVar6[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}